

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall ON_OBSOLETE_V5_Leader::RemovePoint(ON_OBSOLETE_V5_Leader *this,int idx)

{
  int iVar1;
  
  iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (idx == -1) {
    (*(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
      _vptr_ON_SimpleArray[2])(&(this->super_ON_OBSOLETE_V5_Annotation).m_points,(ulong)(iVar1 - 1))
    ;
  }
  else {
    if (iVar1 <= idx || idx < 0) {
      return false;
    }
    ON_SimpleArray<ON_2dPoint>::Remove
              (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,
               idx);
  }
  return true;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::RemovePoint( int idx )
{
  bool rc = true;
  if( idx == -1)  // -1 removes the last point
  {
    m_points.Remove();
  }
  else if( idx >= 0 && idx < m_points.Count())
  {
    m_points.Remove( idx);
  }
  else
  {
    rc = false;
  }

  return rc;
}